

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(longlong lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  longlong local_18;
  
  local_20.m_int = 0;
  bVar1 = ModulusSimpleCaseHelper<long,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::ModulusSimpleCase(lhs,rhs,&local_20);
  if (!bVar1) {
    local_18 = lhs;
    local_20.m_int =
         (long)SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                         ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *
                          )&local_18,rhs.m_int);
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_20.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}